

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

bool __thiscall
helics::apps::AppTextParser::loadNextLine(AppTextParser *this,string *line,int *lineNumber)

{
  ifstream *piVar1;
  istream iVar2;
  pointer pcVar3;
  char cVar4;
  bool bVar5;
  istream *piVar6;
  size_type sVar7;
  
  piVar1 = &this->filePtr;
  cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)&this->filePtr + -0x18) + (char)piVar1);
  piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)piVar1,(string *)line,cVar4);
  iVar2 = piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20];
  do {
    bVar5 = ((byte)iVar2 & 5) == 0;
    if (!bVar5) {
      return bVar5;
    }
    this->currentLineNumber = this->currentLineNumber + 1;
    if ((line->_M_string_length != 0) &&
       (sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_not_of(line," \t\n\r",0,4), sVar7 != 0xffffffffffffffff)) {
      if (this->mLineComment == true) {
        if (((sVar7 + 2 < line->_M_string_length) &&
            (pcVar3 = (line->_M_dataplus)._M_p, pcVar3[sVar7] == '#')) &&
           ((pcVar3[sVar7 + 1] == '#' && (pcVar3[sVar7 + 2] == ']')))) {
          bVar5 = false;
LAB_001bdd5c:
          this->mLineComment = bVar5;
        }
      }
      else {
        pcVar3 = (line->_M_dataplus)._M_p;
        if (pcVar3[sVar7] != '!') {
          if (pcVar3[sVar7] != '#') {
            *lineNumber = this->currentLineNumber;
            return bVar5;
          }
          if (((sVar7 + 2 < line->_M_string_length) && (pcVar3[sVar7 + 1] == '#')) &&
             (bVar5 = true, pcVar3[sVar7 + 2] == '[')) goto LAB_001bdd5c;
        }
      }
    }
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)piVar1,(string *)line,cVar4);
    iVar2 = piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20];
  } while( true );
}

Assistant:

bool AppTextParser::loadNextLine(std::string& line, int& lineNumber)
{
    while (std::getline(filePtr, line)) {
        ++currentLineNumber;
        if (line.empty()) {
            continue;
        }
        auto firstChar = line.find_first_not_of(" \t\n\r\0");
        if (firstChar == std::string::npos) {
            continue;
        }
        if (mLineComment) {
            if (firstChar + 2 < line.size()) {
                if ((line[firstChar] == '#') && (line[firstChar + 1] == '#') &&
                    (line[firstChar + 2] == ']')) {
                    mLineComment = false;
                }
            }
            continue;
        }
        if (line[firstChar] == '#') {
            if (firstChar + 2 < line.size()) {
                if ((line[firstChar + 1] == '#') && (line[firstChar + 2] == '[')) {
                    mLineComment = true;
                }
            }
            continue;
        }
        if (line[firstChar] == '!') {
            continue;
        }
        lineNumber = currentLineNumber;
        return true;
    }
    return false;
}